

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse_extra.c
# Opt level: O2

void mod2sparse_print_terminal(mod2sparse *A)

{
  uint uVar1;
  mod2dense *r;
  int j;
  int col;
  int i;
  int row;
  
  r = mod2dense_allocate(A->n_rows,A->n_cols);
  mod2sparse_to_dense(A,r);
  for (row = 0; row < r->n_rows; row = row + 1) {
    for (col = 0; col < r->n_cols; col = col + 1) {
      uVar1 = mod2dense_get(r,row,col);
      printf("%d",(ulong)uVar1);
    }
    putchar(10);
  }
  mod2dense_free(r);
  return;
}

Assistant:

void mod2sparse_print_terminal(mod2sparse *A){
  int M,N;
  mod2dense *Adense;
  M=mod2sparse_rows(A);
  N=mod2sparse_cols(A);

  Adense=mod2dense_allocate(M,N);

  mod2sparse_to_dense(A,Adense);
for (int i = 0; i<mod2dense_rows(Adense); i++)
  { for (int j = 0; j<mod2dense_cols(Adense); j++)
    { printf("%d",mod2dense_get(Adense,i,j));
    }
    printf("\n");
  }

  mod2dense_free(Adense);

}